

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

void Scl_LibertyParseDumpItem(FILE *pFile,Scl_Tree_t *p,Scl_Item_t *pItem,int nOffset)

{
  char cVar1;
  uint uVar2;
  Scl_Item_t *pItem_00;
  size_t __size;
  char *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  
  while( true ) {
    iVar4 = pItem->Type;
    if (iVar4 == 3) {
      iVar4 = nOffset;
      if (0 < nOffset) {
        do {
          fputc(0x20,(FILE *)pFile);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar6 = (long)(pItem->Key).Beg;
      lVar5 = (long)pItem->Key >> 0x20;
      if (lVar6 < lVar5) {
        pcVar3 = p->pContents;
        pcVar7 = pcVar3 + lVar6;
        do {
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          fputc((int)cVar1,(FILE *)pFile);
        } while (pcVar7 < pcVar3 + lVar5);
      }
      fputc(0x28,(FILE *)pFile);
      lVar6 = (long)(pItem->Head).Beg;
      lVar5 = (long)pItem->Head >> 0x20;
      if (lVar6 < lVar5) {
        pcVar3 = p->pContents;
        pcVar7 = pcVar3 + lVar6;
        do {
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          fputc((int)cVar1,(FILE *)pFile);
        } while (pcVar7 < pcVar3 + lVar5);
      }
      __size = 3;
      pcVar3 = ");\n";
    }
    else if (iVar4 == 2) {
      iVar4 = nOffset;
      if (0 < nOffset) {
        do {
          fputc(0x20,(FILE *)pFile);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar6 = (long)(pItem->Key).Beg;
      lVar5 = (long)pItem->Key >> 0x20;
      if (lVar6 < lVar5) {
        pcVar3 = p->pContents;
        pcVar7 = pcVar3 + lVar6;
        do {
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          fputc((int)cVar1,(FILE *)pFile);
        } while (pcVar7 < pcVar3 + lVar5);
      }
      fwrite(" : ",3,1,(FILE *)pFile);
      lVar6 = (long)(pItem->Head).Beg;
      lVar5 = (long)pItem->Head >> 0x20;
      if (lVar6 < lVar5) {
        pcVar3 = p->pContents;
        pcVar7 = pcVar3 + lVar6;
        do {
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          fputc((int)cVar1,(FILE *)pFile);
        } while (pcVar7 < pcVar3 + lVar5);
      }
      __size = 2;
      pcVar3 = ";\n";
    }
    else {
      if (iVar4 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLiberty.c"
                      ,0x84,"void Scl_LibertyParseDumpItem(FILE *, Scl_Tree_t *, Scl_Item_t *, int)"
                     );
      }
      iVar4 = nOffset;
      if (0 < nOffset) {
        do {
          fputc(0x20,(FILE *)pFile);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar6 = (long)(pItem->Key).Beg;
      lVar5 = (long)pItem->Key >> 0x20;
      if (lVar6 < lVar5) {
        pcVar3 = p->pContents;
        pcVar7 = pcVar3 + lVar6;
        do {
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          fputc((int)cVar1,(FILE *)pFile);
        } while (pcVar7 < pcVar3 + lVar5);
      }
      fputc(0x28,(FILE *)pFile);
      lVar6 = (long)(pItem->Head).Beg;
      lVar5 = (long)pItem->Head >> 0x20;
      if (lVar6 < lVar5) {
        pcVar3 = p->pContents;
        pcVar7 = pcVar3 + lVar6;
        do {
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          fputc((int)cVar1,(FILE *)pFile);
        } while (pcVar7 < pcVar3 + lVar5);
      }
      fwrite(") {\n",4,1,(FILE *)pFile);
      uVar2 = pItem->Child;
      if (p->nItems <= (int)uVar2) break;
      if ((-1 < (int)uVar2) && (p->pItems != (Scl_Item_t *)0x0)) {
        if ((int)uVar2 < 0) {
          pItem_00 = (Scl_Item_t *)0x0;
        }
        else {
          pItem_00 = p->pItems + uVar2;
        }
        Scl_LibertyParseDumpItem(pFile,p,pItem_00,nOffset + 2);
      }
      iVar4 = nOffset;
      if (0 < nOffset) {
        do {
          fputc(0x20,(FILE *)pFile);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      __size = 2;
      pcVar3 = "}\n";
    }
    fwrite(pcVar3,__size,1,(FILE *)pFile);
    uVar2 = pItem->Next;
    if (p->nItems <= (int)uVar2) break;
    if (((int)uVar2 < 0) || (p->pItems == (Scl_Item_t *)0x0)) {
      return;
    }
    pItem = (Scl_Item_t *)0x0;
    if (-1 < (int)uVar2) {
      pItem = p->pItems + uVar2;
    }
  }
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

void Scl_LibertyParseDumpItem( FILE * pFile, Scl_Tree_t * p, Scl_Item_t * pItem, int nOffset )
{
    if ( pItem->Type == SCL_LIBERTY_PROC )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, "(" );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ") {\n" );
        if ( Scl_LibertyItem(p, pItem->Child) )
            Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyItem(p, pItem->Child), nOffset + 2 );
        Scl_PrintSpace( pFile, nOffset );
        fprintf( pFile, "}\n" );
    }
    else if ( pItem->Type == SCL_LIBERTY_EQUA )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, " : " );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ";\n" );
    }
    else if ( pItem->Type == SCL_LIBERTY_LIST )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, "(" );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ");\n" );
    }
    else assert( 0 );
    if ( Scl_LibertyItem(p, pItem->Next) )
        Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyItem(p, pItem->Next), nOffset );
}